

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_midiplay.cpp
# Opt level: O1

void __thiscall MIDIplay::updateVibrato(MIDIplay *this,double amount)

{
  pointer pMVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  
  lVar2 = (long)(this->m_midiChannels).
                super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_midiChannels).
                super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (lVar2 != 0) {
    lVar2 = (lVar2 >> 6) * -0x3333333333333333;
    lVar4 = 0;
    uVar3 = 0;
    do {
      pMVar1 = (this->m_midiChannels).
               super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (((pMVar1->noteAftertouch[lVar4 + 0xffffffffffffffeb] == '\0' &&
            pMVar1->noteAftertouch[lVar4 + 0xffffffffffffffea] == '\0') &&
          (pMVar1->_padding[lVar4 + 0xffffffffffffffff] != '\x01')) ||
         (*(long *)(pMVar1->_padding2 + lVar4 + 0x13) == 0)) {
        *(undefined8 *)(pMVar1->_padding + lVar4 + 0x1f) = 0;
      }
      else {
        noteUpdateAll(this,uVar3 & 0xffff,8);
        pMVar1 = (this->m_midiChannels).
                 super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        *(double *)(pMVar1->_padding + lVar4 + 0x1f) =
             *(double *)(pMVar1->_padding2 + lVar4 + 0xffffffffffffffe3) * amount +
             *(double *)(pMVar1->_padding + lVar4 + 0x1f);
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x140;
    } while (lVar2 + (ulong)(lVar2 == 0) != uVar3);
  }
  return;
}

Assistant:

void MIDIplay::updateVibrato(double amount)
{
    for(size_t a = 0, b = m_midiChannels.size(); a < b; ++a)
    {
        if(m_midiChannels[a].hasVibrato() && !m_midiChannels[a].activenotes.empty())
        {
            noteUpdateAll(static_cast<uint16_t>(a), Upd_Pitch);
            m_midiChannels[a].vibpos += amount * m_midiChannels[a].vibspeed;
        }
        else
            m_midiChannels[a].vibpos = 0.0;
    }
}